

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O3

void TasGrid::constructSurrogate<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,double tolerance,
               TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
               string *checkpoint_filename)

{
  BaseCanonicalGrid *pBVar1;
  char cVar2;
  runtime_error *this;
  TypeRefinement local_74;
  double local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  local_74 = criteria;
  local_70 = tolerance;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    cVar2 = (**(code **)(*(long *)pBVar1 + 0x20))();
    if (cVar2 != '\0') {
LAB_0010eef8:
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
      ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
                  *)&local_48,model);
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_68._M_unused._M_object = operator_new(0x20);
      *(double **)local_68._M_unused._0_8_ = &local_70;
      *(TypeRefinement **)((long)local_68._M_unused._0_8_ + 8) = &local_74;
      *(int **)((long)local_68._M_unused._0_8_ + 0x10) = &output;
      *(vector<int,_std::allocator<int>_> **)((long)local_68._M_unused._0_8_ + 0x18) = level_limits;
      pcStack_50 = std::
                   _Function_handler<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgConstructSurrogate.hpp:473:44)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgConstructSurrogate.hpp:473:44)>
                 ::_M_manager;
      constructCommon<false,false>
                ((ModelSignature *)&local_48,max_num_points,num_parallel_jobs,max_samples_per_job,
                 grid,(function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>
                       *)&local_68,checkpoint_filename);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      return;
    }
    pBVar1 = (grid->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 != (BaseCanonicalGrid *)0x0) {
      cVar2 = (**(code **)(*(long *)pBVar1 + 0x28))();
      if (cVar2 != '\0') goto LAB_0010eef8;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,
             "ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet."
            );
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void constructSurrogate(ModelSignature model,
                        size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                        TasmanianSparseGrid &grid,
                        double tolerance, TypeRefinement criteria, int output = -1,
                        std::vector<int> const &level_limits = std::vector<int>(),
                        std::string const &checkpoint_filename = std::string()){
    if (!grid.isLocalPolynomial() && !grid.isWavelet()) throw std::runtime_error("ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet.");
    constructCommon<parallel_construction, initial_guess>
                                          (model, max_num_points, num_parallel_jobs, max_samples_per_job, grid,
                                           [&](TasmanianSparseGrid &g)->std::vector<double>{
                                               return g.getCandidateConstructionPoints(tolerance, criteria, output, level_limits);
                                           }, checkpoint_filename);
}